

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O2

void set_port_option<boost::asio::serial_port_base::character_size>
               (serial_port *port,character_size *option,string *device_name,string *name)

{
  runtime_error *this;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = boost::system::system_category();
  boost::asio::
  basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::set_option<boost::asio::serial_port_base::character_size>(&port->port,option,&ec);
  if (ec.failed_ != true) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_d0,"error setting \"",name);
  std::operator+(&local_b0,&local_d0,"\" on \"");
  std::operator+(&local_90,&local_b0,device_name);
  std::operator+(&local_70,&local_90,"\": ");
  (*(ec.cat_)->_vptr_error_category[4])(&local_f0,ec.cat_,(ulong)(uint)ec.val_);
  std::operator+(&local_50,&local_70,&local_f0);
  std::runtime_error::runtime_error(this,(string *)&local_50);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_port_option( serial_port& port, const O& option,
    const std::string& device_name, const std::string& name )
{
    boost::system::error_code ec;
    port.port.set_option( option, ec );

    if ( ec )
        throw std::runtime_error( "error setting \"" + name + "\" on \"" + device_name + "\": " + ec.message() );
}